

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall
Assimp::ValidateDSProcess::Validate
          (ValidateDSProcess *this,aiAnimation *pAnimation,aiMeshMorphAnim *pMeshMorphAnim)

{
  double dVar1;
  double dVar2;
  aiMeshMorphKey *paVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  
  Validate(this,&pMeshMorphAnim->mName);
  uVar4 = (ulong)pMeshMorphAnim->mNumKeys;
  if (pMeshMorphAnim->mNumKeys == 0) {
    ReportError(this,"Empty mesh morph animation channel");
  }
  paVar3 = pMeshMorphAnim->mKeys;
  if (paVar3 != (aiMeshMorphKey *)0x0) {
    dVar7 = -100000000000.0;
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (uVar4 <= uVar6) {
        return;
      }
      dVar1 = pAnimation->mDuration;
      if (0.0 < dVar1) {
        dVar2 = *(double *)((long)&paVar3->mTime + lVar5);
        if (dVar1 + 0.001 < dVar2) {
          ReportError(this,
                      "aiMeshMorphAnim::mKeys[%i].mTime (%.5f) is larger than aiAnimation::mDuration (which is %.5f)"
                      ,(double)(float)dVar2,(double)(float)dVar1,uVar6 & 0xffffffff);
        }
      }
      if ((uVar6 != 0) && (dVar1 = *(double *)((long)&paVar3->mTime + lVar5), dVar1 <= dVar7)) {
        ReportWarning(this,
                      "aiMeshMorphAnim::mKeys[%i].mTime (%.5f) is smaller than aiMeshMorphAnim::mKeys[%i] (which is %.5f)"
                      ,(double)(float)dVar1,(double)(float)dVar7,uVar6 & 0xffffffff,
                      (ulong)((int)uVar6 - 1));
        paVar3 = pMeshMorphAnim->mKeys;
        uVar4 = (ulong)pMeshMorphAnim->mNumKeys;
      }
      dVar7 = *(double *)((long)&paVar3->mTime + lVar5);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x20;
    } while( true );
  }
  ReportError(this,"aiMeshMorphAnim::mKeys is NULL (aiMeshMorphAnim::mNumKeys is %i)");
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation,
     const aiMeshMorphAnim* pMeshMorphAnim)
{
    Validate(&pMeshMorphAnim->mName);

    if (!pMeshMorphAnim->mNumKeys) {
        ReportError("Empty mesh morph animation channel");
    }

    // otherwise check whether one of the keys exceeds the total duration of the animation
    if (pMeshMorphAnim->mNumKeys)
    {
        if (!pMeshMorphAnim->mKeys)
        {
            ReportError("aiMeshMorphAnim::mKeys is NULL (aiMeshMorphAnim::mNumKeys is %i)",
                pMeshMorphAnim->mNumKeys);
        }
        double dLast = -10e10;
        for (unsigned int i = 0; i < pMeshMorphAnim->mNumKeys;++i)
        {
            // ScenePreprocessor will compute the duration if still the default value
            // (Aramis) Add small epsilon, comparison tended to fail if max_time == duration,
            //  seems to be due the compilers register usage/width.
            if (pAnimation->mDuration > 0. && pMeshMorphAnim->mKeys[i].mTime > pAnimation->mDuration+0.001)
            {
                ReportError("aiMeshMorphAnim::mKeys[%i].mTime (%.5f) is larger "
                    "than aiAnimation::mDuration (which is %.5f)",i,
                    (float)pMeshMorphAnim->mKeys[i].mTime,
                    (float)pAnimation->mDuration);
            }
            if (i && pMeshMorphAnim->mKeys[i].mTime <= dLast)
            {
                ReportWarning("aiMeshMorphAnim::mKeys[%i].mTime (%.5f) is smaller "
                    "than aiMeshMorphAnim::mKeys[%i] (which is %.5f)",i,
                    (float)pMeshMorphAnim->mKeys[i].mTime,
                    i-1, (float)dLast);
            }
            dLast = pMeshMorphAnim->mKeys[i].mTime;
        }
    }
}